

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotate_bspline.h
# Opt level: O1

bool __thiscall
Rotate_BSpline_Segment::intersect(Rotate_BSpline_Segment *this,Ray *ray,Hit *h,float tmin)

{
  Vector3f *pVVar1;
  undefined1 (*pauVar2) [64];
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  pointer pdVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double *pdVar17;
  Vector3f *this_00;
  bool bVar18;
  iterator __begin1;
  float *pfVar19;
  pointer pdVar20;
  ulong uVar21;
  double *u;
  pointer pdVar22;
  double *pdVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  float fVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined8 in_XMM2_Qa;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar42;
  vector<double,_std::allocator<double>_> z;
  vector<double,_std::allocator<double>_> x;
  vector<double,_std::allocator<double>_> t;
  vector<double,_std::allocator<double>_> f;
  Vector3f pyy_1;
  Vector3f pxx_1;
  Vector3f pxx;
  Vector3f pyy;
  vector<double,_std::allocator<double>_> oo;
  vector<double,_std::allocator<double>_> local_298;
  double local_280;
  float local_274;
  double local_270;
  Vector3f *local_268;
  Vector3f *local_260;
  Hit *local_258;
  vector<double,_std::allocator<double>_> local_250;
  undefined1 local_238 [16];
  double *local_228;
  vector<double,_std::allocator<double>_> local_220;
  undefined1 local_208 [16];
  Ray *local_1f0;
  Vector3f local_1e4;
  undefined1 local_1d8 [16];
  double *local_1c0;
  Vector3f local_1b8;
  Vector3f local_1ac;
  Vector3f local_1a0;
  Vector3f local_194;
  vector<double,_std::allocator<double>_> local_188;
  Vector2f *local_170;
  vector<double,_std::allocator<double>_> local_168;
  vector<double,_std::allocator<double>_> local_150;
  vector<double,_std::allocator<double>_> local_138;
  vector<double,_std::allocator<double>_> local_120;
  vector<double,_std::allocator<double>_> local_108;
  vector<double,_std::allocator<double>_> local_f0;
  vector<double,_std::allocator<double>_> local_d8;
  vector<double,_std::allocator<double>_> local_c0;
  vector<double,_std::allocator<double>_> local_a8;
  vector<double,_std::allocator<double>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  Vector3f local_48;
  Vector3f local_3c;
  undefined1 auVar43 [16];
  
  (*(this->super_Object)._vptr_Object[1])((BoundingBox *)local_238,this);
  local_258 = h;
  bVar18 = BoundingBox::intersect((BoundingBox *)local_238,ray,tmin,h->t + 0.001);
  if (bVar18) {
    pVVar1 = &ray->d;
    pfVar19 = Vector3f::operator[](pVVar1,1);
    auVar24._8_4_ = 0x7fffffff;
    auVar24._0_8_ = 0x7fffffff7fffffff;
    auVar24._12_4_ = 0x7fffffff;
    auVar24 = vandps_avx512vl(ZEXT416((uint)*pfVar19),auVar24);
    if (1e-05 <= auVar24._0_4_) {
      operator-(&ray->o);
      local_260 = &this->o;
      operator+((Vector3f *)&local_250,local_260);
      pfVar19 = Vector3f::operator[]((Vector3f *)local_238,1);
      fVar28 = *pfVar19;
      pfVar19 = Vector3f::operator[](pVVar1,1);
      fVar3 = *pfVar19;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_238,&this->py);
      if (local_238._8_8_ == local_238._0_8_) {
        local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (double *)0x0;
        if ((double *)local_238._8_8_ == local_228) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_238,(iterator)local_238._8_8_,
                     (double *)&local_250);
        }
        else {
          *(double *)local_238._8_8_ = 0.0;
          local_238._8_8_ = local_238._8_8_ + 8;
        }
      }
      local_208._0_8_ = (double)fVar28;
      *(double *)local_238._0_8_ = (double)fVar28 + *(double *)local_238._0_8_;
      if (local_238._0_8_ != local_238._8_8_) {
        auVar36 = vpbroadcastq_avx512f();
        auVar35._0_8_ = (double)(1.0 / fVar3);
        auVar35._8_8_ = in_XMM2_Qa;
        auVar36 = vpsrlq_avx512f(auVar36,3);
        auVar37 = vbroadcastsd_avx512f(auVar35);
        uVar21 = 0;
        auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          auVar26 = vpbroadcastq_avx512f();
          auVar26 = vporq_avx512f(auVar26,auVar25);
          uVar13 = vpcmpuq_avx512f(auVar26,auVar36,2);
          pdVar17 = (double *)(local_238._0_8_ + uVar21 * 8);
          auVar26._8_8_ = (ulong)((byte)(uVar13 >> 1) & 1) * (long)pdVar17[1];
          auVar26._0_8_ = (ulong)((byte)uVar13 & 1) * (long)*pdVar17;
          auVar26._16_8_ = (ulong)((byte)(uVar13 >> 2) & 1) * (long)pdVar17[2];
          auVar26._24_8_ = (ulong)((byte)(uVar13 >> 3) & 1) * (long)pdVar17[3];
          auVar26._32_8_ = (ulong)((byte)(uVar13 >> 4) & 1) * (long)pdVar17[4];
          auVar26._40_8_ = (ulong)((byte)(uVar13 >> 5) & 1) * (long)pdVar17[5];
          auVar26._48_8_ = (ulong)((byte)(uVar13 >> 6) & 1) * (long)pdVar17[6];
          auVar26._56_8_ = (uVar13 >> 7) * (long)pdVar17[7];
          auVar26 = vmulpd_avx512f(auVar26,auVar37);
          pauVar2 = (undefined1 (*) [64])(local_238._0_8_ + uVar21 * 8);
          bVar18 = (bool)((byte)uVar13 & 1);
          auVar27._0_8_ = (ulong)bVar18 * auVar26._0_8_ | (ulong)!bVar18 * (long)*(double *)*pauVar2
          ;
          bVar18 = (bool)((byte)(uVar13 >> 1) & 1);
          auVar27._8_8_ =
               (ulong)bVar18 * auVar26._8_8_ |
               (ulong)!bVar18 * (long)*(double *)((long)*pauVar2 + 8);
          bVar18 = (bool)((byte)(uVar13 >> 2) & 1);
          auVar27._16_8_ =
               (ulong)bVar18 * auVar26._16_8_ |
               (ulong)!bVar18 * (long)*(double *)((long)*pauVar2 + 0x10);
          bVar18 = (bool)((byte)(uVar13 >> 3) & 1);
          auVar27._24_8_ =
               (ulong)bVar18 * auVar26._24_8_ |
               (ulong)!bVar18 * (long)*(double *)((long)*pauVar2 + 0x18);
          bVar18 = (bool)((byte)(uVar13 >> 4) & 1);
          auVar27._32_8_ =
               (ulong)bVar18 * auVar26._32_8_ |
               (ulong)!bVar18 * (long)*(double *)((long)*pauVar2 + 0x20);
          bVar18 = (bool)((byte)(uVar13 >> 5) & 1);
          auVar27._40_8_ =
               (ulong)bVar18 * auVar26._40_8_ |
               (ulong)!bVar18 * (long)*(double *)((long)*pauVar2 + 0x28);
          bVar18 = (bool)((byte)(uVar13 >> 6) & 1);
          auVar27._48_8_ =
               (ulong)bVar18 * auVar26._48_8_ |
               (ulong)!bVar18 * (long)*(double *)((long)*pauVar2 + 0x30);
          auVar27._56_8_ =
               (uVar13 >> 7) * auVar26._56_8_ |
               (ulong)!SUB81(uVar13 >> 7,0) * (long)*(double *)((long)*pauVar2 + 0x38);
          *pauVar2 = auVar27;
          uVar21 = uVar21 + 8;
        } while ((((ulong)(local_238._8_8_ + (-8 - local_238._0_8_)) >> 3) + 8 & 0xfffffffffffffff8)
                 != uVar21);
      }
      std::vector<double,_std::allocator<double>_>::vector
                (&local_250,(vector<double,_std::allocator<double>_> *)local_238);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_298,(vector<double,_std::allocator<double>_> *)local_238);
      for (pdVar22 = local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pdVar22 !=
          local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish; pdVar22 = pdVar22 + 1) {
        pfVar19 = Vector3f::operator[](pVVar1,0);
        *pdVar22 = (double)*pfVar19 * *pdVar22;
      }
      operator-(&ray->o,local_260);
      pfVar19 = Vector3f::operator[]((Vector3f *)&local_220,0);
      pdVar22 = local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
      *local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start = (double)*pfVar19 +
                   *local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
      for (pdVar20 = local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start; pdVar20 != pdVar22; pdVar20 = pdVar20 + 1) {
        pfVar19 = Vector3f::operator[](pVVar1,2);
        *pdVar20 = (double)*pfVar19 * *pdVar20;
      }
      operator-(&ray->o,local_260);
      pfVar19 = Vector3f::operator[]((Vector3f *)&local_220,2);
      *local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start = (double)*pfVar19 +
                   *local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
      std::vector<double,_std::allocator<double>_>::vector(&local_a8,&local_250);
      std::vector<double,_std::allocator<double>_>::vector(&local_c0,&local_250);
      poly_mul<double>(&local_90,&local_a8,&local_c0);
      std::vector<double,_std::allocator<double>_>::vector(&local_f0,&local_298);
      std::vector<double,_std::allocator<double>_>::vector(&local_108,&local_298);
      poly_mul<double>(&local_d8,&local_f0,&local_108);
      poly_add<double>(&local_78,&local_90,&local_d8);
      std::vector<double,_std::allocator<double>_>::vector(&local_138,&this->px);
      std::vector<double,_std::allocator<double>_>::vector(&local_150,&this->px);
      poly_mul<double>(&local_120,&local_138,&local_150);
      poly_minus<double>(&local_220,&local_78,&local_120);
      if (local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_150.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_150.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::vector<double,_std::allocator<double>_>::vector(&local_168,&local_220);
      Poly_Solver::poly_solve(&local_188,&local_168,this->l,this->r,1e-11);
      if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar18 = false;
      }
      else {
        local_280 = (double)tmin;
        pVVar1 = &local_258->norm;
        local_170 = &local_258->pos;
        bVar18 = false;
        pdVar22 = local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_1f0 = ray;
        do {
          dVar29 = *pdVar22;
          if ((this->l <= dVar29) && (dVar29 <= this->r)) {
            pdVar20 = (this->py).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar12 = (this->py).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            dVar33 = 0.0;
            auVar24 = ZEXT816(0);
            if (pdVar20 != pdVar12) {
              auVar36 = ZEXT1664(ZEXT816(0x3ff0000000000000));
              do {
                auVar8._8_8_ = 0;
                auVar8._0_8_ = *pdVar20;
                auVar24 = vfmadd231sd_fma(auVar24,auVar36._0_16_,auVar8);
                dVar33 = auVar24._0_8_;
                auVar36 = ZEXT864((ulong)(dVar29 * auVar36._0_8_));
                pdVar20 = pdVar20 + 1;
              } while (pdVar20 != pdVar12);
            }
            dVar33 = (dVar33 + (double)local_208._0_8_) * (double)(1.0 / fVar3);
            if ((local_280 <= dVar33) && (dVar33 < (double)local_258->t)) {
              pdVar20 = (this->px).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar12 = (this->px).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              auVar36 = ZEXT864(0) << 0x40;
              local_1d8 = auVar36._0_16_;
              if (pdVar20 != pdVar12) {
                auVar37 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                do {
                  auVar9._8_8_ = 0;
                  auVar9._0_8_ = *pdVar20;
                  local_1d8 = vfmadd231sd_fma(auVar36._0_16_,auVar37._0_16_,auVar9);
                  auVar36 = ZEXT1664(local_1d8);
                  auVar37 = ZEXT864((ulong)(dVar29 * auVar37._0_8_));
                  pdVar20 = pdVar20 + 1;
                } while (pdVar20 != pdVar12);
              }
              local_1c0 = (double *)CONCAT44(local_1c0._4_4_,(float)dVar33);
              ::operator*(&local_194,(float)dVar33);
              operator+(&local_1f0->o,&local_194);
              operator-(&local_1e4,local_260);
              pfVar19 = Vector3f::operator[](&local_1a0,0);
              local_268 = (Vector3f *)CONCAT44(local_268._4_4_,*pfVar19);
              pfVar19 = Vector3f::operator[](&local_1a0,0);
              local_270 = (double)CONCAT44(local_270._4_4_,*pfVar19);
              pfVar19 = Vector3f::operator[](&local_1a0,2);
              local_274 = *pfVar19;
              pfVar19 = Vector3f::operator[](&local_1a0,2);
              auVar24 = vfmadd132ss_fma(ZEXT416(local_270._0_4_),
                                        ZEXT416((uint)(local_274 * *pfVar19)),
                                        ZEXT416((uint)local_268));
              auVar32._0_8_ = (double)auVar24._0_4_;
              auVar32._8_8_ = auVar24._8_8_;
              auVar24 = vfnmadd213sd_fma(local_1d8,local_1d8,auVar32);
              auVar16._8_4_ = 0xffffffff;
              auVar16._0_8_ = 0x7fffffffffffffff;
              auVar16._12_4_ = 0x7fffffff;
              auVar24 = vandpd_avx512vl(auVar24,auVar16);
              if (auVar24._0_8_ <= 0.0001) {
                local_258->t = local_1c0._0_4_;
                local_258->obj = &this->super_Object;
                ::operator*(&local_1ac,local_1c0._0_4_);
                operator+(&local_1f0->o,&local_1ac);
                operator-(&local_1e4,local_260);
                Vector3f::Vector3f(&local_1e4,0.0,1.0,0.0);
                pfVar19 = Vector3f::operator[](&local_194,0);
                local_1d8._0_4_ = *pfVar19;
                pfVar19 = Vector3f::operator[](&local_194,2);
                Vector3f::Vector3f(&local_1b8,(float)local_1d8._0_4_,0.0,*pfVar19);
                Vector3f::normalized(&local_1ac);
                pdVar20 = (this->nx).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar12 = (this->nx).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                if (pdVar20 == pdVar12) {
                  fVar28 = 0.0;
                }
                else {
                  auVar24 = ZEXT816(0);
                  auVar36 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                  do {
                    auVar10._8_8_ = 0;
                    auVar10._0_8_ = *pdVar20;
                    auVar24 = vfmadd231sd_fma(auVar24,auVar36._0_16_,auVar10);
                    auVar36 = ZEXT864((ulong)(dVar29 * auVar36._0_8_));
                    pdVar20 = pdVar20 + 1;
                  } while (pdVar20 != pdVar12);
                  fVar28 = (float)auVar24._0_8_;
                }
                ::operator*(&local_3c,fVar28);
                pdVar20 = (this->ny).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar12 = (this->ny).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                if (pdVar20 == pdVar12) {
                  fVar28 = 0.0;
                }
                else {
                  auVar24 = ZEXT416(0);
                  auVar36 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                  do {
                    auVar11._8_8_ = 0;
                    auVar11._0_8_ = *pdVar20;
                    auVar24 = vfmadd231sd_fma(auVar24,auVar36._0_16_,auVar11);
                    auVar36 = ZEXT864((ulong)(dVar29 * auVar36._0_8_));
                    pdVar20 = pdVar20 + 1;
                  } while (pdVar20 != pdVar12);
                  fVar28 = (float)auVar24._0_8_;
                }
                ::operator*(&local_48,fVar28);
                operator+(&local_3c,&local_48);
                Vector3f::operator=(pVVar1,&local_1b8);
                Vector3f::normalize(pVVar1);
                Vector2f::operator=(local_170,&Vector2f::ZERO);
                bVar18 = true;
              }
            }
          }
          pdVar22 = pdVar22 + 1;
        } while (pdVar22 !=
                 local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_238,&this->py);
      if (local_238._8_8_ == local_238._0_8_) {
        local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (double *)0x0;
        if ((double *)local_238._8_8_ == local_228) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_238,(iterator)local_238._8_8_,
                     (double *)&local_250);
        }
        else {
          *(double *)local_238._8_8_ = 0.0;
          local_238._8_8_ = local_238._8_8_ + 8;
        }
      }
      local_1d8._0_8_ = &this->o;
      operator-(&this->o,&ray->o);
      pfVar19 = Vector3f::operator[]((Vector3f *)&local_250,1);
      *(double *)local_238._0_8_ = (double)*pfVar19 + *(double *)local_238._0_8_;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_60,(vector<double,_std::allocator<double>_> *)local_238);
      Poly_Solver::poly_solve(&local_250,&local_60,this->l,this->r,1e-07);
      if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar18 = false;
      }
      else {
        local_268 = &local_258->norm;
        local_1f0 = (Ray *)&local_258->pos;
        bVar18 = false;
        local_1c0 = local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        pdVar22 = local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          dVar29 = *pdVar22;
          if ((this->l <= dVar29) && (local_270 = dVar29, dVar29 <= this->r)) {
            pfVar19 = Vector3f::operator[](pVVar1,0);
            local_208._0_8_ = (double)*pfVar19;
            operator-(&ray->o,(Vector3f *)local_1d8._0_8_);
            pfVar19 = Vector3f::operator[]((Vector3f *)&local_298,0);
            fVar28 = *pfVar19;
            pfVar19 = Vector3f::operator[](pVVar1,2);
            local_280 = (double)*pfVar19;
            operator-(&ray->o,(Vector3f *)local_1d8._0_8_);
            pfVar19 = Vector3f::operator[]((Vector3f *)&local_298,2);
            pdVar20 = (this->px).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar12 = (this->px).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            dVar29 = 0.0;
            auVar24 = ZEXT816(0) << 0x40;
            if (pdVar20 != pdVar12) {
              auVar36 = ZEXT1664(ZEXT816(0x3ff0000000000000));
              do {
                auVar4._8_8_ = 0;
                auVar4._0_8_ = *pdVar20;
                auVar24 = vfmadd231sd_fma(auVar24,auVar36._0_16_,auVar4);
                dVar29 = auVar24._0_8_;
                auVar36 = ZEXT864((ulong)(local_270 * auVar36._0_8_));
                pdVar20 = pdVar20 + 1;
              } while (pdVar20 != pdVar12);
            }
            dVar33 = (double)*pfVar19;
            auVar38._8_8_ = 0;
            auVar38._0_8_ = local_208._0_8_;
            auVar43._8_8_ = 0;
            auVar43._0_8_ = local_280 * local_280;
            auVar24 = vfmadd231sd_fma(auVar43,auVar38,auVar38);
            dVar42 = auVar24._0_8_;
            auVar40._8_8_ = 0;
            auVar40._0_8_ = (double)fVar28;
            auVar39._8_8_ = 0;
            auVar39._0_8_ = (double)local_208._0_8_ + (double)local_208._0_8_;
            auVar41._8_8_ = 0;
            auVar41._0_8_ = (local_280 + local_280) * dVar33;
            local_208 = vfmadd231sd_fma(auVar41,auVar40,auVar39);
            auVar34._8_8_ = 0;
            auVar34._0_8_ = dVar33 * dVar33;
            auVar24 = vfmadd231sd_fma(auVar34,auVar40,auVar40);
            local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (double *)0x0;
            local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (double *)0x0;
            local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (double *)0x0;
            auVar30._8_8_ = 0;
            auVar30._0_8_ = dVar42 * -4.0 * (auVar24._0_8_ - dVar29 * dVar29);
            auVar24 = vfmadd231sd_fma(auVar30,local_208,local_208);
            dVar29 = auVar24._0_8_;
            pdVar23 = local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar17 = local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (dVar29 >= 0.0) {
              if (dVar29 < 0.0) {
                dVar29 = sqrt(dVar29);
              }
              else {
                auVar24 = vsqrtsd_avx(auVar24,auVar24);
                dVar29 = auVar24._0_8_;
              }
              auVar14._12_4_ = 0x80000000;
              auVar14._0_12_ = ZEXT812(0x8000000000000000);
              auVar24 = vxorpd_avx512vl(local_208,auVar14);
              local_280 = dVar42 + dVar42;
              local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)((auVar24._0_8_ - dVar29) / local_280);
              if (local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          (&local_298,
                           (iterator)
                           local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,(double *)&local_220);
              }
              else {
                *local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish =
                     (double)local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((dVar29 - (double)local_208._0_8_) / local_280);
              if (local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          (&local_298,
                           (iterator)
                           local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,(double *)&local_220);
                pdVar23 = local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar17 = local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              }
              else {
                *local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish =
                     (double)local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
                pdVar23 = local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar17 = local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              }
            }
            for (; pdVar23 != pdVar17; pdVar23 = pdVar23 + 1) {
              dVar29 = *pdVar23;
              if (((double)tmin <= dVar29) && (dVar29 < (double)local_258->t)) {
                pdVar20 = (this->px).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar12 = (this->px).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                auVar36 = ZEXT864(0) << 0x40;
                local_208 = auVar36._0_16_;
                if (pdVar20 != pdVar12) {
                  auVar37 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                  do {
                    auVar5._8_8_ = 0;
                    auVar5._0_8_ = *pdVar20;
                    local_208 = vfmadd231sd_fma(auVar36._0_16_,auVar37._0_16_,auVar5);
                    auVar36 = ZEXT1664(local_208);
                    auVar37 = ZEXT864((ulong)(local_270 * auVar37._0_8_));
                    pdVar20 = pdVar20 + 1;
                  } while (pdVar20 != pdVar12);
                }
                local_274 = (float)dVar29;
                ::operator*((Vector3f *)&local_220,local_274);
                operator+(&ray->o,(Vector3f *)&local_220);
                operator-(&local_194,(Vector3f *)local_1d8._0_8_);
                pfVar19 = Vector3f::operator[]((Vector3f *)&local_188,0);
                fVar28 = *pfVar19;
                pfVar19 = Vector3f::operator[]((Vector3f *)&local_188,0);
                local_280 = (double)CONCAT44(local_280._4_4_,*pfVar19);
                pfVar19 = Vector3f::operator[]((Vector3f *)&local_188,2);
                local_260 = (Vector3f *)CONCAT44(local_260._4_4_,*pfVar19);
                pfVar19 = Vector3f::operator[]((Vector3f *)&local_188,2);
                auVar24 = vfmadd132ss_fma(ZEXT416(local_280._0_4_),
                                          ZEXT416((uint)(local_260._0_4_ * *pfVar19)),
                                          ZEXT416((uint)fVar28));
                auVar31._0_8_ = (double)auVar24._0_4_;
                auVar31._8_8_ = auVar24._8_8_;
                auVar24 = vfnmadd213sd_fma(local_208,local_208,auVar31);
                auVar15._8_4_ = 0xffffffff;
                auVar15._0_8_ = 0x7fffffffffffffff;
                auVar15._12_4_ = 0x7fffffff;
                auVar24 = vandpd_avx512vl(auVar24,auVar15);
                if (auVar24._0_8_ <= 0.001) {
                  local_258->t = local_274;
                  local_258->obj = &this->super_Object;
                  ::operator*(&local_1a0,local_274);
                  operator+(&ray->o,&local_1a0);
                  operator-(&local_194,(Vector3f *)local_1d8._0_8_);
                  Vector3f::Vector3f(&local_194,0.0,1.0,0.0);
                  pfVar19 = Vector3f::operator[]((Vector3f *)&local_220,0);
                  local_208._0_4_ = *pfVar19;
                  pfVar19 = Vector3f::operator[]((Vector3f *)&local_220,2);
                  Vector3f::Vector3f(&local_1e4,(float)local_208._0_4_,0.0,*pfVar19);
                  Vector3f::normalized(&local_1a0);
                  pdVar20 = (this->nx).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pdVar12 = (this->nx).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                  if (pdVar20 == pdVar12) {
                    fVar28 = 0.0;
                  }
                  else {
                    auVar24 = ZEXT816(0);
                    auVar36 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                    do {
                      auVar6._8_8_ = 0;
                      auVar6._0_8_ = *pdVar20;
                      auVar24 = vfmadd231sd_fma(auVar24,auVar36._0_16_,auVar6);
                      auVar36 = ZEXT864((ulong)(local_270 * auVar36._0_8_));
                      pdVar20 = pdVar20 + 1;
                    } while (pdVar20 != pdVar12);
                    fVar28 = (float)auVar24._0_8_;
                  }
                  ::operator*(&local_1ac,fVar28);
                  pdVar20 = (this->ny).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pdVar12 = (this->ny).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                  if (pdVar20 == pdVar12) {
                    fVar28 = 0.0;
                  }
                  else {
                    auVar24 = ZEXT416(0);
                    auVar36 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                    do {
                      auVar7._8_8_ = 0;
                      auVar7._0_8_ = *pdVar20;
                      auVar24 = vfmadd231sd_fma(auVar24,auVar36._0_16_,auVar7);
                      auVar36 = ZEXT864((ulong)(local_270 * auVar36._0_8_));
                      pdVar20 = pdVar20 + 1;
                    } while (pdVar20 != pdVar12);
                    fVar28 = (float)auVar24._0_8_;
                  }
                  ::operator*(&local_1b8,fVar28);
                  operator+(&local_1ac,&local_1b8);
                  Vector3f::operator=(local_268,&local_1e4);
                  Vector3f::normalize(local_268);
                  operator-(pVVar1);
                  fVar28 = Vector3f::dot(local_268,&local_1e4);
                  this_00 = local_268;
                  if (fVar28 < 0.0) {
                    operator-(local_268);
                    Vector3f::operator=(this_00,&local_1e4);
                  }
                  Vector2f::operator=((Vector2f *)local_1f0,&Vector2f::ZERO);
                  bVar18 = true;
                }
              }
            }
            local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = local_1c0;
            if (local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (double *)0x0) {
              operator_delete(local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
              local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = local_1c0;
            }
          }
          pdVar22 = pdVar22 + 1;
        } while (pdVar22 !=
                 local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
    }
    if (local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((double *)local_238._0_8_ != (double *)0x0) {
      operator_delete((void *)local_238._0_8_);
    }
  }
  else {
    bVar18 = false;
  }
  return bVar18;
}

Assistant:

bool intersect(const Ray& ray, Hit& h, float tmin) override {
		if (!this->getBound().intersect(ray, tmin, h.t + 1e-3)) return 0;
		//(ray.o+ray.d*t-o)_y=py(u)
		//((ray.o+ray.d*t-o)_x)^2+((ray.o+ray.d*t-o)_z)^2-px(u)^2=0
		//t=(py(u)+Y(-ray.o+o))/Y(ray.d)
		if (fabs(ray.d[1]) < 1e-5) { //almost pararrel
			//py(u)=(ray.o-o)_y
			std::vector<double> f = py;
			if (!f.size()) f.push_back(0);
			f[0]+=(o - ray.o)[1];
			std::vector<double> oo = poly_solve(f, l, r, 1e-7);
			bool suc = 0;
			for (auto u : oo) {
				if (u<l || u>r) continue;
				double k1 = ray.d[0], b1 = (ray.o - o)[0], k2 = ray.d[2], b2 = (ray.o - o)[2], b=poly_calc(px,u);
				b = -b * b;
				//(k1*t+b1)^2+(k2*t+b2)^2+b=0
				double A = k1 * k1 + k2 * k2, B = 2 * k1 * b1 + 2 * k2 * b2, C = b1 * b1 + b2 * b2 + b;
				std::vector<double> og;
				double dt = B * B - 4 * A * C;
				if (dt >= 0) {
					dt = sqrt(dt);
					og.push_back((-B - dt) / (2 * A));
					og.push_back((-B + dt) / (2 * A));
				}
				for(auto g:og)
				if (g >= tmin && g < h.t) {
					double gx = poly_calc(px, u);
					Vector3f f = ray.pos(g) - o;
					double l = f[0] * f[0] + f[2] * f[2]; l -= gx * gx;
					if (fabs(l) > 1e-3) continue;
					h.t = g; h.obj = this;
					Vector3f pos = ray.o + ray.d * h.t - o,
						pyy = Vector3f(0, 1, 0),
						pxx = Vector3f(pos[0], 0, pos[2]).normalized();
//					double X = poly_calc(px, u), Y = poly_calc(py, u);
//					cerr << g << "," << u << "|" << X * X << "," << pos[0] * pos[0] + pos[2] * pos[2] << "|" << Y << "," << pos[1] << "\n";
					h.norm = pxx * poly_calc(nx, u) + pyy * poly_calc(ny, u);
					h.norm.normalize();
					if (Vector3f::dot(h.norm, -ray.d) < 0) h.norm = -h.norm;
					//todo: add pos, too lazy atm
					h.pos = Vector2f::ZERO; suc = 1;
				}
			}
			return suc;
		}
		float b1 = (-ray.o + o)[1], k1 = 1.0 / ray.d[1];
		//t=(py(u)+b1)*k1
		std::vector<double> t = py;
		if (!t.size()) t.push_back(0);
		t[0] += b1;
		for (auto& u : t) u *= k1;
		std::vector<double> x = t, z = t;
		for (auto& u : x) u *= ray.d[0];
		x[0] += (ray.o - o)[0];
		for (auto& u : z) u *= ray.d[2];
		z[0] += (ray.o - o)[2];
		std::vector<double> f = poly_minus(poly_add(poly_mul(x, x), poly_mul(z, z)), poly_mul(px, px));
		std::vector<double> oo = poly_solve(f, l, r, 1e-11);
//		std::cerr << "good!" << f.size() << "w" << oo.size() << "!";
//		for (auto c : oo) std::cerr << c << "|"<<poly_calc(px,c)<<"|"<<poly_calc(f,c)<<","; std::cerr << "\n";
		bool suc = 0;
		for (auto u : oo) {
			if (u<l || u>r) continue;
			double g = poly_calc(py, u);
			g = (g + b1) * k1;
			if (g >= tmin && g < h.t) {
				double gx = poly_calc(px, u);
				Vector3f f = ray.pos(g) - o;
				double l = f[0] * f[0] + f[2] * f[2]; l -= gx * gx;
				if (fabs(l) > 1e-4) continue;
				h.t = g; h.obj = this;
				Vector3f pos = ray.o + ray.d * h.t - o,
					pyy = Vector3f(0, 1, 0),
					pxx = Vector3f(pos[0], 0, pos[2]).normalized();
//				double X = poly_calc(px, u), Y = poly_calc(py, u);
//				cerr << g << "," << u << "|" << X * X << "," << pos[0] * pos[0] + pos[2] * pos[2] << "|" << Y << "," << pos[1] << "\n";
//				cerr<<pos[1]<<" "<<pos[0]*pos[0]+pos[2]*pos[2]<<"  "<<poly_calc(px,u)<<" "<<
				h.norm = pxx * poly_calc(nx, u) + pyy * poly_calc(ny, u);
				h.norm.normalize();
				//if (Vector3f::dot(h.norm, -ray.d)<0) h.norm = -h.norm;
				//todo: add pos, too lazy atm
				h.pos = Vector2f::ZERO; suc = 1;
			}
		}
		return suc;
	}